

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::print(Simulator *this,PCode *code)

{
  Type TVar1;
  reference pvVar2;
  int *piVar3;
  void *pvVar4;
  double *pdVar5;
  simulator_error *this_00;
  allocator local_91;
  string local_90;
  int local_70 [4];
  undefined1 local_60 [8];
  StackSymbol symbol;
  PCode *code_local;
  Simulator *this_local;
  
  symbol.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)code;
  pvVar2 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(&this->stack_);
  StackSymbol::StackSymbol((StackSymbol *)local_60,pvVar2);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  TVar1 = StackSymbol::type((StackSymbol *)local_60);
  if (TVar1 == kInt) {
    piVar3 = StackSymbol::int_value((StackSymbol *)local_60);
    pvVar4 = (void *)std::ostream::operator<<(&std::cout,*piVar3);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    TVar1 = StackSymbol::type((StackSymbol *)local_60);
    if (TVar1 != kReal) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_70[0] = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,anon_var_dwarf_a31a,&local_91);
      simulator_error::simulator_error(this_00,local_70,&local_90);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar5 = StackSymbol::real_value((StackSymbol *)local_60);
    pvVar4 = (void *)std::ostream::operator<<(&std::cout,*pdVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)local_60);
  return;
}

Assistant:

void Simulator::print(const PCode &code) {
    StackSymbol symbol = stack_.back();
    stack_.pop_back();

    if (symbol.type() == StackSymbol::Type::kInt) {
        std::cout << symbol.int_value() << std::endl;
    } else if (symbol.type() == StackSymbol::Type::kReal) {
        std::cout << symbol.real_value() << std::endl;
    } else {
        throw simulator_error(eip(), "不合法的输出参数");
    }

    inc_eip();
}